

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O3

ArgString * __thiscall
Potassco::ArgString::get<Clasp::RestartSchedule>(ArgString *this,RestartSchedule *x)

{
  char cVar1;
  int iVar2;
  int iVar3;
  KV *pKVar4;
  undefined8 in_RCX;
  char *pcVar5;
  AvgType fast;
  Keep keep;
  AvgType slow;
  bool bVar6;
  ScheduleStrategy SVar7;
  uint32 sWin;
  uint32 lim;
  pair<unsigned_int,_double> req;
  char *local_60;
  uint local_58;
  uint local_54;
  pair<unsigned_int,_double> local_50;
  char *local_40;
  char *local_38;
  
  pcVar5 = this->in;
  if (pcVar5 == (char *)0x0) {
    return this;
  }
  cVar1 = *pcVar5;
  bVar6 = cVar1 == this->skip;
  local_60 = pcVar5 + bVar6;
  local_38 = local_60;
  if ((byte)(pcVar5[bVar6] | 0x20U) != 100) {
    iVar3 = Clasp::xconvert(local_60,&x->super_ScheduleStrategy,&local_38,
                            (int)CONCAT71((int7)((ulong)in_RCX >> 8),cVar1));
    local_60 = local_38;
    goto LAB_0012ae13;
  }
  local_50.first = 0;
  local_50.second = 0.0;
  local_54 = 0;
  local_58 = 0;
  local_40 = (char *)0x0;
  iVar3 = 0;
  if (local_60[1] != ',') goto LAB_0012ae13;
  iVar2 = xconvert<unsigned_int,double>(local_60 + 2,&local_50,&local_60,0);
  iVar3 = 0;
  if (((iVar2 == 0) || (local_50.first == 0)) || (iVar3 = 0, local_50.second <= 0.0))
  goto LAB_0012ae13;
  if (*local_60 == ',') {
    iVar3 = 0;
    iVar2 = Potassco::xconvert(local_60 + 1,&local_54,&local_60,0);
    if (iVar2 == 0) goto LAB_0012ae13;
    if (*local_60 != ',') goto LAB_0012add6;
    pKVar4 = findValue((Potassco *)Clasp::enumMap(Clasp::MovingAvg::Type_const*)::map,
                       (Span<Potassco::KV> *)0x5,local_60 + 1,&local_60,",");
    if (pKVar4 == (KV *)0x0) {
LAB_0012aeac:
      iVar3 = 0;
      goto LAB_0012ae13;
    }
    fast = pKVar4->value;
    cVar1 = *local_60;
    slow = avg_sma;
    if ((cVar1 == ',') && (fast != avg_sma)) {
      pKVar4 = findValue((Potassco *)Clasp::enumMap(Clasp::RestartSchedule::Keep_const*)::map,
                         (Span<Potassco::KV> *)0x5,local_60 + 1,&local_40,",");
      if (pKVar4 == (KV *)0x0) {
        keep = keep_never;
      }
      else {
        keep = pKVar4->value;
        local_60 = local_40;
      }
      cVar1 = *local_60;
    }
    else {
      keep = keep_never;
    }
    if (cVar1 == ',') {
      pKVar4 = findValue((Potassco *)Clasp::enumMap(Clasp::MovingAvg::Type_const*)::map,
                         (Span<Potassco::KV> *)0x5,local_60 + 1,&local_60,",");
      if (pKVar4 == (KV *)0x0) goto LAB_0012aeac;
      slow = pKVar4->value;
      if ((*local_60 == ',') && (slow != avg_sma)) {
        iVar3 = 0;
        iVar2 = Potassco::xconvert(local_60 + 1,&local_58,&local_60,0);
        if (iVar2 == 0) goto LAB_0012ae13;
      }
    }
  }
  else {
LAB_0012add6:
    keep = keep_never;
    fast = avg_sma;
    slow = avg_sma;
  }
  SVar7 = (ScheduleStrategy)
          Clasp::RestartSchedule::dynamic
                    (local_50.first,(float)local_50.second,local_54,fast,keep,slow,local_58);
  x->super_ScheduleStrategy = SVar7;
  iVar3 = 1;
LAB_0012ae13:
  pcVar5 = (char *)0x0;
  if (iVar3 != 0) {
    pcVar5 = local_60;
  }
  this->in = pcVar5;
  this->skip = ',';
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}